

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::gls::BindHoleAttributeTest::iterate(BindHoleAttributeTest *this)

{
  undefined1 *puVar1;
  long *plVar2;
  size_type *psVar3;
  int iVar4;
  deUint32 dVar5;
  string local_2f8;
  deUint32 local_2d4;
  BindHoleAttributeTest *local_2d0;
  long *local_2c8 [2];
  long local_2b8 [2];
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  attributes;
  Attribute local_288;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  bindings;
  AttribType vec4;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  noBindings;
  ostringstream s;
  undefined7 uStack_1a7;
  _Alloc_hider _Stack_1a0;
  undefined1 local_198 [16];
  undefined3 local_188;
  undefined1 uStack_185;
  _Alloc_hider local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170 [2];
  _Alloc_hider local_150;
  undefined1 local_140 [272];
  
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d0 = this;
  local_2d4 = anon_unknown_1::getMaxAttributeLocations(this->m_renderCtx);
  _s = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&s,"vec4","");
  vec4.m_name._M_dataplus._M_p = (pointer)&vec4.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&vec4,_s,_Stack_1a0._M_p + _s);
  vec4.m_locationSize = 1;
  vec4.m_glTypeEnum = 0x8b52;
  if (_s != local_198) {
    operator_delete(_s,local_198._0_8_ + 1);
  }
  iVar4 = 1;
  if (local_2d0->m_arraySize != -1) {
    iVar4 = local_2d0->m_arraySize;
  }
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"a_0","");
  puVar1 = (undefined1 *)((long)&local_288.m_type.m_name.field_2 + 8);
  local_288.m_type.m_name._M_dataplus._M_p._0_1_ = 1;
  local_288.m_type.m_name.field_2._8_8_ = 0x737961776c615f5f;
  local_288.m_type.m_name.field_2._M_allocated_capacity = 10;
  local_288.m_type.m_locationSize = CONCAT13(local_288.m_type.m_locationSize._3_1_,0x5f5f);
  local_288.m_type.m_name._M_string_length = (size_type)puVar1;
  AttributeLocationTestUtil::Attribute::Attribute
            ((Attribute *)&s,&vec4,&local_2f8,-1,(Cond *)&local_288,-1);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,(Attribute *)&s);
  if (local_150._M_p != local_140) {
    operator_delete(local_150._M_p,local_140._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != local_170) {
    operator_delete(local_180._M_p,local_170[0]._M_allocated_capacity + 1);
  }
  if (_s != local_198) {
    operator_delete(_s,local_198._0_8_ + 1);
  }
  if ((undefined1 *)local_288.m_type.m_name._M_string_length != puVar1) {
    operator_delete((void *)local_288.m_type.m_name._M_string_length,
                    local_288.m_type.m_name.field_2._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  local_288.m_type.m_name._M_dataplus._M_p = (pointer)&local_288.m_type.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"a_0","");
  _s = local_198;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&s,local_288.m_type.m_name._M_dataplus._M_p,
             (undefined1 *)
             (local_288.m_type.m_name._M_string_length +
             (long)local_288.m_type.m_name._M_dataplus._M_p));
  _local_188 = 0;
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Bind>(&bindings,(Bind *)&s);
  if (_s != local_198) {
    operator_delete(_s,local_198._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.m_type.m_name._M_dataplus._M_p != &local_288.m_type.m_name.field_2) {
    operator_delete(local_288.m_type.m_name._M_dataplus._M_p,
                    local_288.m_type.m_name.field_2._M_allocated_capacity + 1);
  }
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"a_1","");
  local_288.m_type.m_name._M_dataplus._M_p._0_1_ = 1;
  local_288.m_type.m_name.field_2._8_8_ = 0x737961776c615f5f;
  local_288.m_type.m_name.field_2._M_allocated_capacity = 10;
  local_288.m_type.m_locationSize = CONCAT13(local_288.m_type.m_locationSize._3_1_,0x5f5f);
  local_288.m_type.m_name._M_string_length = (size_type)puVar1;
  AttributeLocationTestUtil::Attribute::Attribute
            ((Attribute *)&s,&local_2d0->m_type,&local_2f8,-1,(Cond *)&local_288,
             local_2d0->m_arraySize);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,(Attribute *)&s);
  if (local_150._M_p != local_140) {
    operator_delete(local_150._M_p,local_140._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != local_170) {
    operator_delete(local_180._M_p,local_170[0]._M_allocated_capacity + 1);
  }
  if (_s != local_198) {
    operator_delete(_s,local_198._0_8_ + 1);
  }
  if ((undefined1 *)local_288.m_type.m_name._M_string_length != puVar1) {
    operator_delete((void *)local_288.m_type.m_name._M_string_length,
                    local_288.m_type.m_name.field_2._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  dVar5 = iVar4 * (local_2d0->m_type).m_locationSize + 1;
  if ((int)dVar5 < (int)local_2d4) {
    iVar4 = 2;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      std::ostream::operator<<((Cond *)&s,iVar4);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      std::ios_base::~ios_base((ios_base *)(local_140 + 8));
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_2c8,0,(char *)0x0,0x685933);
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_2f8.field_2._M_allocated_capacity = *psVar3;
        local_2f8.field_2._8_8_ = plVar2[3];
      }
      else {
        local_2f8.field_2._M_allocated_capacity = *psVar3;
        local_2f8._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_2f8._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      s = (ostringstream)0x1;
      local_198._8_8_ = 0x737961776c615f5f;
      local_198._0_8_ = 10;
      local_188 = 0x5f5f;
      AttributeLocationTestUtil::Attribute::Attribute(&local_288,&vec4,&local_2f8,-1,(Cond *)&s,-1);
      std::
      vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
      ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,&local_288);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288.m_cond.m_name._M_dataplus._M_p != &local_288.m_cond.m_name.field_2) {
        operator_delete(local_288.m_cond.m_name._M_dataplus._M_p,
                        local_288.m_cond.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288.m_name._M_dataplus._M_p != &local_288.m_name.field_2) {
        operator_delete(local_288.m_name._M_dataplus._M_p,
                        local_288.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288.m_type.m_name._M_dataplus._M_p != &local_288.m_type.m_name.field_2) {
        operator_delete(local_288.m_type.m_name._M_dataplus._M_p,
                        local_288.m_type.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      if (local_2c8[0] != local_2b8) {
        operator_delete(local_2c8[0],local_2b8[0] + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      std::ostream::operator<<((Cond *)&s,iVar4);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      std::ios_base::~ios_base((ios_base *)(local_140 + 8));
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_2c8,0,(char *)0x0,0x685933);
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_2f8.field_2._M_allocated_capacity = *psVar3;
        local_2f8.field_2._8_8_ = plVar2[3];
      }
      else {
        local_2f8.field_2._M_allocated_capacity = *psVar3;
        local_2f8._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_2f8._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      local_288.m_type.m_name._M_dataplus._M_p = (pointer)&local_288.m_type.m_name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_288,local_2f8._M_dataplus._M_p,
                 local_2f8._M_dataplus._M_p + local_2f8._M_string_length);
      local_288.m_type.m_locationSize = dVar5;
      std::
      vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
      ::emplace_back<deqp::gls::AttributeLocationTestUtil::Bind>(&bindings,(Bind *)&local_288);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288.m_type.m_name._M_dataplus._M_p != &local_288.m_type.m_name.field_2) {
        operator_delete(local_288.m_type.m_name._M_dataplus._M_p,
                        local_288.m_type.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      if (local_2c8[0] != local_2b8) {
        operator_delete(local_2c8[0],local_2b8[0] + 1);
      }
      iVar4 = iVar4 + 1;
      dVar5 = dVar5 + 1;
    } while (local_2d4 != dVar5);
  }
  _s = (pointer)0x0;
  local_198._0_8_ = 0;
  AttributeLocationTestUtil::runTest
            ((local_2d0->super_TestCase).super_TestNode.m_testCtx,local_2d0->m_renderCtx,&attributes
             ,&noBindings,&bindings,&noBindings,false,false,
             (vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
              *)&s);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector((vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
             *)&s);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&bindings);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector(&attributes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vec4.m_name._M_dataplus._M_p != &vec4.m_name.field_2) {
    operator_delete(vec4.m_name._M_dataplus._M_p,vec4.m_name.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&noBindings);
  return STOP;
}

Assistant:

deInt32 getMaxAttributeLocations (glu::RenderContext& renderCtx)
{
	const glw::Functions& gl = renderCtx.getFunctions();
	deInt32 maxAttribs;

	gl.getIntegerv(GL_MAX_VERTEX_ATTRIBS, &maxAttribs);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv()");

	return maxAttribs;
}